

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndr.h
# Opt level: O1

void Ndr_AddObject(void *pDesign,int ModuleId,int ObjType,int InstName,int RangeLeft,int RangeRight,
                  int fSignedness,int nInputs,int *pInputs,int nOutputs,int *pOutputs,
                  char *pFunction)

{
  byte *pbVar1;
  int *piVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  
  iVar6 = *pDesign;
  iVar4 = iVar6 + 6;
  if (*(int *)((long)pDesign + 4) < iVar4) {
    iVar5 = *(int *)((long)pDesign + 4) * 2;
    if (iVar5 <= iVar4) {
      iVar5 = iVar4;
    }
    *(int *)((long)pDesign + 4) = iVar5;
    pvVar3 = realloc(*(void **)((long)pDesign + 8),(long)iVar5);
    *(void **)((long)pDesign + 8) = pvVar3;
    pvVar3 = realloc(*(void **)((long)pDesign + 0x10),(long)*(int *)((long)pDesign + 4) << 2);
    *(void **)((long)pDesign + 0x10) = pvVar3;
  }
  *(undefined1 *)(*(long *)((long)pDesign + 8) + (long)*pDesign) = 3;
  iVar4 = *pDesign;
  *(int *)pDesign = iVar4 + 1;
  *(undefined4 *)(*(long *)((long)pDesign + 0x10) + (long)iVar4 * 4) = 0;
  *(undefined1 *)(*(long *)((long)pDesign + 8) + (long)*pDesign) = 6;
  iVar4 = *pDesign;
  *(int *)pDesign = iVar4 + 1;
  *(int *)(*(long *)((long)pDesign + 0x10) + (long)iVar4 * 4) = ObjType;
  if (InstName != 0) {
    if (InstName < 1) {
      __assert_fail("nArray > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                    ,0xcc,"void Ndr_DataPushArray(Ndr_Data_t *, int, int, int *)");
    }
    iVar4 = *pDesign + InstName;
    if (*(int *)((long)pDesign + 4) < iVar4) {
      iVar5 = *(int *)((long)pDesign + 4) * 2;
      if (iVar5 <= iVar4) {
        iVar5 = iVar4;
      }
      *(int *)((long)pDesign + 4) = iVar5;
      pvVar3 = realloc(*(void **)((long)pDesign + 8),(long)iVar5);
      *(void **)((long)pDesign + 8) = pvVar3;
      pvVar3 = realloc(*(void **)((long)pDesign + 0x10),(long)*(int *)((long)pDesign + 4) << 2);
      *(void **)((long)pDesign + 0x10) = pvVar3;
    }
    memset((void *)((long)*pDesign + *(long *)((long)pDesign + 8)),4,(ulong)(uint)InstName);
    memcpy((void *)((long)*pDesign * 4 + *(long *)((long)pDesign + 0x10)),
           (void *)CONCAT44(in_register_00000084,RangeLeft),(ulong)(uint)InstName << 2);
    *(int *)pDesign = *pDesign + InstName;
  }
  if (*(int *)((long)pDesign + 4) <= *pDesign) {
    iVar5 = *pDesign + 1;
    iVar4 = *(int *)((long)pDesign + 4) * 2;
    if (iVar4 <= iVar5) {
      iVar4 = iVar5;
    }
    *(int *)((long)pDesign + 4) = iVar4;
    pvVar3 = realloc(*(void **)((long)pDesign + 8),(long)iVar4);
    *(void **)((long)pDesign + 8) = pvVar3;
    pvVar3 = realloc(*(void **)((long)pDesign + 0x10),(long)*(int *)((long)pDesign + 4) << 2);
    *(void **)((long)pDesign + 0x10) = pvVar3;
  }
  *(undefined1 *)(*(long *)((long)pDesign + 8) + (long)*pDesign) = 5;
  *(undefined4 *)(*(long *)((long)pDesign + 0x10) + (long)*pDesign * 4) =
       *(undefined4 *)CONCAT44(in_register_0000008c,RangeRight);
  iVar4 = *pDesign;
  *(int *)pDesign = iVar4 + 1;
  pbVar1 = *(byte **)((long)pDesign + 8);
  if (pbVar1[iVar6] != 0) {
    if (pbVar1[iVar6] < 4) {
      piVar2 = *(int **)((long)pDesign + 0x10);
      piVar2[iVar6] = piVar2[iVar6] + ((iVar4 + 1) - iVar6);
      if (pbVar1[(long)ModuleId + -0x100] == 0) goto LAB_003909f6;
      if (pbVar1[(long)ModuleId + -0x100] < 4) {
        piVar2[(long)ModuleId + -0x100] = piVar2[(long)ModuleId + -0x100] + (*pDesign - iVar6);
        if (*pbVar1 == 0) goto LAB_003909f6;
        if (*pbVar1 < 4) {
          iVar6 = (*pDesign - iVar6) + *piVar2;
          *piVar2 = iVar6;
          if (iVar6 == *pDesign) {
            return;
          }
          __assert_fail("(int)p->pBody[0] == p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                        ,0x239,
                        "void Ndr_AddObject(void *, int, int, int, int, int, int, int, int *, int, int *, char *)"
                       );
        }
      }
    }
    __assert_fail("Ndr_DataType(p, i) <= NDR_OBJECT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                  ,0x83,"void Ndr_DataAddTo(Ndr_Data_t *, int, int)");
  }
LAB_003909f6:
  __assert_fail("p->pHead[i]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/ndr.h"
                ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
}

Assistant:

static inline void Ndr_AddObject( void * pDesign, int ModuleId,
                                  int ObjType, int InstName, 
                                  int RangeLeft, int RangeRight, int fSignedness, 
                                  int nInputs, int * pInputs, 
                                  int nOutputs, int * pOutputs, 
                                  char * pFunction )
{
    Ndr_Data_t * p = (Ndr_Data_t *)pDesign;
    int Mod = ModuleId - 256;  
    int Obj = p->nSize;  assert( ObjType != 0 );
    Ndr_DataResize( p, 6 );
    Ndr_DataPush( p, NDR_OBJECT, 0 );
    Ndr_DataPush( p, NDR_OPERTYPE, ObjType );
    Ndr_DataPushRange( p, RangeLeft, RangeRight, fSignedness );
    if ( InstName )
        Ndr_DataPush( p, NDR_NAME, InstName );
    Ndr_DataPushArray( p, NDR_INPUT, nInputs, pInputs );
    Ndr_DataPushArray( p, NDR_OUTPUT, nOutputs, pOutputs );
    Ndr_DataPushString( p, ObjType, NDR_FUNCTION, pFunction );
    Ndr_DataAddTo( p, Obj, p->nSize - Obj );
    Ndr_DataAddTo( p, Mod, p->nSize - Obj );
    Ndr_DataAddTo( p, 0, p->nSize - Obj );
    assert( (int)p->pBody[0] == p->nSize );
}